

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hn-state.cpp
# Opt level: O0

void __thiscall HN::State::forceUpdate(State *this,ItemIds *toUpdate)

{
  bool bVar1;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *p_Var2;
  const_iterator __k;
  reference piVar3;
  mapped_type *pmVar4;
  map<int,_HN::Item,_std::less<int>,_std::allocator<std::pair<const_int,_HN::Item>_>_> *in_RSI;
  int id;
  const_iterator __end1;
  const_iterator __begin1;
  ItemIds *__range1;
  uint64_t tNow_s;
  map<int,_HN::Item,_std::less<int>,_std::allocator<std::pair<const_int,_HN::Item>_>_>
  *in_stack_ffffffffffffff98;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *in_stack_ffffffffffffffa0
  ;
  _Self local_48;
  _Self local_40;
  int local_34;
  int *local_30;
  
  p_Var2 = (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)t_s();
  __k = std::vector<int,_std::allocator<int>_>::begin
                  ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff98);
  local_30 = (int *)std::vector<int,_std::allocator<int>_>::end
                              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff98);
  while (bVar1 = __gnu_cxx::operator!=
                           (in_stack_ffffffffffffffa0,
                            (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                             *)in_stack_ffffffffffffff98), bVar1) {
    piVar3 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       &stack0xffffffffffffffd8);
    local_34 = *piVar3;
    local_40._M_node =
         (_Base_ptr)
         std::map<int,_HN::Item,_std::less<int>,_std::allocator<std::pair<const_int,_HN::Item>_>_>::
         find(in_stack_ffffffffffffff98,(key_type *)0x119f85);
    local_48._M_node =
         (_Base_ptr)
         std::map<int,_HN::Item,_std::less<int>,_std::allocator<std::pair<const_int,_HN::Item>_>_>::
         end(in_stack_ffffffffffffff98);
    bVar1 = std::operator==(&local_40,&local_48);
    if ((!bVar1) &&
       (pmVar4 = std::
                 map<int,_HN::Item,_std::less<int>,_std::allocator<std::pair<const_int,_HN::Item>_>_>
                 ::operator[](in_RSI,__k._M_current),
       0x3c < (long)p_Var2 - pmVar4->lastForceUpdate_s)) {
      pmVar4 = std::
               map<int,_HN::Item,_std::less<int>,_std::allocator<std::pair<const_int,_HN::Item>_>_>
               ::operator[](in_RSI,__k._M_current);
      pmVar4->needUpdate = true;
      pmVar4 = std::
               map<int,_HN::Item,_std::less<int>,_std::allocator<std::pair<const_int,_HN::Item>_>_>
               ::operator[](in_RSI,__k._M_current);
      pmVar4->needRequest = true;
      in_stack_ffffffffffffffa0 = p_Var2;
      pmVar4 = std::
               map<int,_HN::Item,_std::less<int>,_std::allocator<std::pair<const_int,_HN::Item>_>_>
               ::operator[](in_RSI,__k._M_current);
      pmVar4->lastForceUpdate_s = (uint64_t)in_stack_ffffffffffffffa0;
    }
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
               &stack0xffffffffffffffd8);
  }
  return;
}

Assistant:

void State::forceUpdate(const ItemIds & toUpdate) {
        auto tNow_s = t_s();
        for (auto id : toUpdate) {
            if (items.find(id) == items.end()) continue;
            if (tNow_s - items[id].lastForceUpdate_s > 60) {
                items[id].needUpdate = true;
                items[id].needRequest = true;

                items[id].lastForceUpdate_s = tNow_s;
            }
        }
    }